

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

int tiologcls(tiocxdef *ctx)

{
  if (logfp != (osfildef *)0x0) {
    fclose((FILE *)logfp);
    os_settype(logfname,2);
    logfp = (osfildef *)0x0;
  }
  return 0;
}

Assistant:

int tiologcls(tiocxdef *ctx)
{
    /* if we have a file, close it */
    if (logfp != 0)
    {
        /* close the handle */
        osfcls(logfp);

        /* set the system file type to "log file" */
        os_settype(logfname, OSFTLOG);

        /* forget about our log file handle */
        logfp = 0;
    }

    /* success */
    return 0;
}